

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool Curl_conncache_foreach
                (Curl_easy *data,conncache *connc,void *param,
                _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func)

{
  void *pvVar1;
  connectdata *pcVar2;
  Curl_share *pCVar3;
  _Bool _Var4;
  int iVar5;
  Curl_hash_element *pCVar6;
  _Bool _Var7;
  undefined8 *puVar8;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_48;
  
  if (connc == (conncache *)0x0) {
    return false;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  Curl_hash_start_iterate(&connc->hash,&CStack_48);
  pCVar6 = Curl_hash_next_element(&CStack_48);
  do {
    if (pCVar6 == (Curl_hash_element *)0x0) {
      _Var7 = false;
      pCVar3 = data->share;
      _Var4 = false;
joined_r0x00542655:
      if (pCVar3 != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        _Var4 = _Var7;
      }
      return _Var4;
    }
    pvVar1 = pCVar6->ptr;
    pCVar6 = Curl_hash_next_element(&CStack_48);
    puVar8 = *(undefined8 **)((long)pvVar1 + 0x10);
    while (puVar8 != (undefined8 *)0x0) {
      pcVar2 = (connectdata *)*puVar8;
      puVar8 = (undefined8 *)puVar8[2];
      iVar5 = (*func)(data,pcVar2,param);
      if (iVar5 == 1) {
        _Var7 = true;
        pCVar3 = data->share;
        _Var4 = true;
        goto joined_r0x00542655;
      }
    }
  } while( true );
}

Assistant:

bool Curl_conncache_foreach(struct Curl_easy *data,
                            struct conncache *connc,
                            void *param,
                            int (*func)(struct Curl_easy *data,
                                        struct connectdata *conn, void *param))
{
  struct Curl_hash_iterator iter;
  struct Curl_llist_element *curr;
  struct Curl_hash_element *he;

  if(!connc)
    return FALSE;

  CONNCACHE_LOCK(data);
  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectbundle *bundle;

    bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = bundle->conn_list.head;
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = curr->ptr;
      curr = curr->next;

      if(1 == func(data, conn, param)) {
        CONNCACHE_UNLOCK(data);
        return TRUE;
      }
    }
  }
  CONNCACHE_UNLOCK(data);
  return FALSE;
}